

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZDICT_printHex(void *ptr,size_t length)

{
  byte bVar1;
  BYTE *b;
  size_t sVar2;
  
  if (length != 0) {
    sVar2 = 0;
    do {
      bVar1 = *(byte *)((long)ptr + sVar2);
      if ((byte)(*(byte *)((long)ptr + sVar2) + 0x81) < 0xa1) {
        bVar1 = 0x2e;
      }
      fputc((uint)bVar1,_stderr);
      fflush(_stderr);
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return;
}

Assistant:

static void ZDICT_printHex(const void* ptr, size_t length)
{
    const BYTE* const b = (const BYTE*)ptr;
    size_t u;
    for (u=0; u<length; u++) {
        BYTE c = b[u];
        if (c<32 || c>126) c = '.';   /* non-printable char */
        DISPLAY("%c", c);
    }
}